

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::JsonValueHandler::rawCopy(JsonValueHandler *this,Reader input,Builder output)

{
  Reader value;
  bool bVar1;
  WiderType<Decay<unsigned_int>,_Decay<unsigned_int>_> end;
  uchar *__dest;
  uchar *__src;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> __n;
  uint *puVar2;
  Reader local_f8;
  Builder local_d8;
  uint local_bc;
  Iterator local_b8;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> local_a8;
  Range<unsigned_int> *local_a0;
  Range<unsigned_int> *__range2;
  Builder ptrOut;
  Reader ptrIn;
  size_t local_38;
  undefined1 local_30 [8];
  ArrayPtr<unsigned_char> dataOut;
  ArrayPtr<const_unsigned_char> dataIn;
  JsonValueHandler *this_local;
  
  join_0x00000010_0x00000000_ = AnyStruct::Reader::getDataSection(&input);
  _local_30 = AnyStruct::Builder::getDataSection(&output);
  __dest = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)local_30);
  __src = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&dataOut.size_);
  local_38 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)local_30);
  ptrIn.reader._40_8_ =
       kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&dataOut.size_);
  __n = kj::min<unsigned_long,unsigned_long>(&local_38,(unsigned_long *)&ptrIn.reader.nestingLimit);
  memcpy(__dest,__src,__n);
  AnyStruct::Reader::getPointerSection((Reader *)&ptrOut.builder.structDataSize,&input);
  AnyStruct::Builder::getPointerSection((Builder *)&__range2,&output);
  __begin2.value =
       List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size
                 ((Reader *)&ptrOut.builder.structDataSize);
  __end2.value = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size((Builder *)&__range2);
  end = kj::min<unsigned_int,unsigned_int>(&__begin2.value,&__end2.value);
  local_a8 = kj::zeroTo<unsigned_int>(end);
  local_a0 = &local_a8;
  i = (uint)kj::Range<unsigned_int>::begin(local_a0);
  local_b8 = kj::Range<unsigned_int>::end(local_a0);
  while( true ) {
    bVar1 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_b8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    local_bc = *puVar2;
    List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::operator[]
              (&local_d8,(Builder *)&__range2,local_bc);
    List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
              (&local_f8,(Reader *)&ptrOut.builder.structDataSize,local_bc);
    value.reader.capTable = local_f8.reader.capTable;
    value.reader.segment = local_f8.reader.segment;
    value.reader.pointer = local_f8.reader.pointer;
    value.reader.nestingLimit = local_f8.reader.nestingLimit;
    value.reader._28_4_ = local_f8.reader._28_4_;
    AnyPointer::Builder::set(&local_d8,value);
    kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  return;
}

Assistant:

void rawCopy(AnyStruct::Reader input, AnyStruct::Builder output) const {
    // HACK: Manually copy using AnyStruct, so that if JsonValue's definition changes, this code
    //   doesn't need to be updated. However, note that if JsonValue ever adds new fields that
    //   change its size, and the input struct is a newer version than the output, we may lose
    //   the new fields. Technically the "correct" thing to do would be to allocate the output
    //   struct to be exactly the same size as the input, but JsonCodec's Handler interface is
    //   not designed to allow that -- it passes in an already-allocated builder. Oops.
    auto dataIn = input.getDataSection();
    auto dataOut = output.getDataSection();
    memcpy(dataOut.begin(), dataIn.begin(), kj::min(dataOut.size(), dataIn.size()));

    auto ptrIn = input.getPointerSection();
    auto ptrOut = output.getPointerSection();
    for (auto i: kj::zeroTo(kj::min(ptrIn.size(), ptrOut.size()))) {
      ptrOut[i].set(ptrIn[i]);
    }
  }